

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_optimization_01.cpp
# Opt level: O3

void optimizaiton_example_01(void)

{
  _Any_data *this;
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  value_type *__val;
  time_t tVar4;
  ostream *poVar5;
  undefined8 uVar6;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  size_type __n;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  vector<double,_std::allocator<double>_> best_objective;
  vector<double,_std::allocator<double>_> points;
  ObjectiveFunction objective;
  vector<double,_std::allocator<double>_> values;
  TasmanianSparseGrid grid;
  ParticleSwarmState state;
  allocator_type local_45a;
  allocator_type local_459;
  vector<double,_std::allocator<double>_> local_458;
  vector<double,_std::allocator<double>_> local_438;
  vector<double,_std::allocator<double>_> local_418;
  vector<double,_std::allocator<double>_> local_400;
  _Any_data local_3e8;
  code *local_3d8;
  code *local_3d0;
  vector<double,_std::allocator<double>_> local_3c8;
  vector<double,_std::allocator<double>_> *local_3a8;
  undefined8 local_3a0;
  code *local_398;
  code *local_390;
  anon_class_40_2_4528a0b4 local_388 [5];
  double local_2a8 [2];
  double local_298 [2];
  _Any_data local_288;
  code *local_278;
  _Any_data local_268;
  code *local_258;
  _Any_data local_248;
  code *local_238;
  vector<double,_std::allocator<double>_> local_228 [5];
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  code *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  code *local_160;
  undefined8 local_158;
  code *local_150;
  code *local_148;
  code *local_140;
  undefined8 local_138;
  code *local_130;
  code *local_128;
  code *local_120;
  undefined8 local_118;
  code *local_110;
  code *local_108;
  ParticleSwarmState local_100 [4];
  int local_fc;
  int local_f8;
  long local_c0;
  
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "---------------------------------------------------------------------------------------------------\n"
             ,100);
  lVar1 = std::cout;
  *(uint *)(TasOptimization::ParticleSwarmState::initializeParticlesInsideBox +
           *(long *)(std::cout + -0x18)) =
       *(uint *)(TasOptimization::ParticleSwarmState::initializeParticlesInsideBox +
                *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)(TasGrid::TasmanianSparseGrid::differentiate + *(long *)(lVar1 + -0x18)) = 5;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "EXAMPLE 1: use the Particle Swarm algorithm to minimize the six-hump camel function\n"
             ,0x54);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "           f(x,y) = (4-2.1 *x^2 + x^4 / 3) * x^2 + x * y + (-4 + 4 * y^2) * y^2\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"           domain is x in (-3, +3), y in (-2, +2)\n",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"           using 50 particles and 200 iterations\n",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"    See the comments in example_optimization_01.cpp\n\n",0x35);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "the problem has two solutions at (-8.98420e-02, 7.12656e-01) and (8.98420e-02, -7.12656e-01)\n"
             ,0x5d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the objective at the solutions is -1.03163.\n\n",0x2d);
  TasOptimization::ParticleSwarmState::ParticleSwarmState(local_100,2,0x32);
  local_3e8._M_unused._M_object = (void *)0xc008000000000000;
  local_3e8._8_8_ = 0xc000000000000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_3e8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_388,__l,(allocator_type *)&local_438);
  local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4008000000000000;
  local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x4000000000000000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_458;
  std::vector<double,_std::allocator<double>_>::vector
            (local_228,__l_00,(allocator_type *)&local_400);
  local_118 = 0;
  local_120 = TasDREAM::tsgCoreUniform01;
  local_108 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_110 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox(local_100,local_388,local_228);
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,3);
  }
  if (local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_388[0]._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_388[0]._0_8_,
                    local_388[0].f_single.super__Function_base._M_functor._8_8_ - local_388[0]._0_8_
                   );
  }
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  local_190 = std::
              _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Examples/example_optimization_01.cpp:68:21)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Examples/example_optimization_01.cpp:68:21)>
              ::_M_manager;
  this = (_Any_data *)&local_388[0].f_single;
  local_388[0].num_dimensions = 2;
  std::function<double_(const_std::vector<double,_std::allocator<double>_>_&)>::function
            ((function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)this,
             (function<double_(const_std::vector<double,_std::allocator<double>_>_&)> *)&local_1a8);
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::
  function<TasOptimization::makeObjectiveFunction(int,std::function<double(std::vector<double,std::allocator<double>>const&)>)::_lambda(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)_1_,void>
            ((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
              *)local_3e8._M_pod_data,local_388);
  if (local_388[0].f_single.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_388[0].f_single.super__Function_base._M_manager)(this,this,__destroy_functor);
  }
  if (local_198 != (code *)0x0) {
    (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
  }
  std::
  function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_248,
             (function<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&)>
              *)&local_3e8);
  local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0xc008000000000000;
  local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xc000000000000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_458;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_388,__l_01,
             (allocator_type *)&local_400);
  local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x4008000000000000;
  local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x4000000000000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_438;
  std::vector<double,_std::allocator<double>_>::vector
            (local_228,__l_02,(allocator_type *)&local_3c8);
  TasDREAM::hypercube((DreamDomain *)&local_268,(vector<double,_std::allocator<double>_> *)local_388
                      ,local_228);
  local_138 = 0;
  local_140 = TasDREAM::tsgCoreUniform01;
  local_128 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_130 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  TasOptimization::ParticleSwarm(0,0x4000000000000000,0,&local_248,&local_268,200,local_100);
  if (local_130 != (code *)0x0) {
    (*local_130)(&local_140,&local_140,3);
  }
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,__destroy_functor);
  }
  if (local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((double *)local_388[0]._0_8_ != (double *)0x0) {
    operator_delete((void *)local_388[0]._0_8_,
                    local_388[0].f_single.super__Function_base._M_functor._8_8_ - local_388[0]._0_8_
                   );
  }
  if (local_238 != (code *)0x0) {
    (*local_238)(&local_248,&local_248,__destroy_functor);
  }
  _Var7._M_current = (double *)((long)local_f8 * (long)local_fc * 8 + local_c0);
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&local_458,_Var7,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (_Var7._M_current + local_fc),(allocator_type *)local_388);
  local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(8);
  local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
  *local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (local_3d8 != (code *)0x0) {
    (*local_3d0)(&local_3e8,&local_458,&local_438);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Using the objective function\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"found best position after 200 iteration:\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"best value for x = ",0x13);
    poVar5 = std::ostream::_M_insert<double>
                       (*local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"best value for y = ",0x13);
    poVar5 = std::ostream::_M_insert<double>
                       (local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"value of the objective = ",0x19);
    poVar5 = std::ostream::_M_insert<double>
                       (*local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n",2);
    local_388[0]._0_8_ = (double *)0x0;
    local_388[0].f_single.super__Function_base._M_functor._M_unused._M_object = (pointer)0x0;
    local_388[0].f_single.super__Function_base._M_functor._8_8_ = (pointer)0x0;
    TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)local_228);
    TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
              ((int)local_228,2,1,10,rule_clenshawcurtis,(vector *)0x25);
    if ((double *)local_388[0]._0_8_ != (double *)0x0) {
      operator_delete((void *)local_388[0]._0_8_,
                      local_388[0].f_single.super__Function_base._M_functor._8_8_ -
                      local_388[0]._0_8_);
    }
    local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xc008000000000000;
    local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xc000000000000000;
    __l_03._M_len = 2;
    __l_03._M_array = (iterator)&local_3c8;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_388,__l_03,
               (allocator_type *)local_298);
    local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x4008000000000000;
    local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x4000000000000000;
    __l_04._M_len = 2;
    __l_04._M_array = (iterator)&local_418;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_400,__l_04,(allocator_type *)local_2a8);
    TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)local_228,(vector *)local_388);
    if (local_400.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_400.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_400.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_400.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((double *)local_388[0]._0_8_ != (double *)0x0) {
      operator_delete((void *)local_388[0]._0_8_,
                      local_388[0].f_single.super__Function_base._M_functor._8_8_ -
                      local_388[0]._0_8_);
    }
    TasGrid::TasmanianSparseGrid::getNeededPoints(&local_400,(TasmanianSparseGrid *)local_228);
    if (local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      __n = 0;
    }
    else {
      __n = (size_type)
            *(int *)(local_228[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 9);
    }
    std::vector<double,_std::allocator<double>_>::vector(&local_3c8,__n,(allocator_type *)local_388)
    ;
    if (local_3d8 != (code *)0x0) {
      (*local_3d0)(&local_3e8,&local_400,&local_3c8);
      TasGrid::TasmanianSparseGrid::loadNeededValues((vector *)local_228);
      TasOptimization::ParticleSwarmState::ParticleSwarmState
                ((ParticleSwarmState *)local_388,2,0x32);
      TasOptimization::ParticleSwarmState::operator=(local_100,(ParticleSwarmState *)local_388);
      TasOptimization::ParticleSwarmState::~ParticleSwarmState((ParticleSwarmState *)local_388);
      local_298[0] = -3.0;
      local_298[1] = -2.0;
      __l_05._M_len = 2;
      __l_05._M_array = local_298;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_388,__l_05,&local_459);
      local_2a8[0] = 3.0;
      local_2a8[1] = 2.0;
      __l_06._M_len = 2;
      __l_06._M_array = local_2a8;
      std::vector<double,_std::allocator<double>_>::vector(&local_418,__l_06,&local_45a);
      local_158 = 0;
      local_160 = TasDREAM::tsgCoreUniform01;
      local_148 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
      local_150 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
      TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
                (local_100,local_388,&local_418);
      if (local_150 != (code *)0x0) {
        (*local_150)(&local_160,&local_160,3);
      }
      if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((double *)local_388[0]._0_8_ != (double *)0x0) {
        operator_delete((void *)local_388[0]._0_8_,
                        local_388[0].f_single.super__Function_base._M_functor._8_8_ -
                        local_388[0]._0_8_);
      }
      TasGrid::TasmanianSparseGrid::enableAcceleration((TypeAcceleration)local_228);
      local_3a0 = 0;
      local_390 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Examples/example_optimization_01.cpp:112:31)>
                  ::_M_invoke;
      local_398 = std::
                  _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Examples/example_optimization_01.cpp:112:31)>
                  ::_M_manager;
      local_298[0] = -3.0;
      local_298[1] = -2.0;
      __l_07._M_len = 2;
      __l_07._M_array = local_298;
      local_3a8 = local_228;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_388,__l_07,&local_459);
      local_2a8[0] = 3.0;
      local_2a8[1] = 2.0;
      __l_08._M_len = 2;
      __l_08._M_array = local_2a8;
      std::vector<double,_std::allocator<double>_>::vector(&local_418,__l_08,&local_45a);
      TasDREAM::hypercube((DreamDomain *)&local_288,
                          (vector<double,_std::allocator<double>_> *)local_388,&local_418);
      local_178 = 0;
      local_180 = TasDREAM::tsgCoreUniform01;
      local_168 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
      local_170 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
      TasOptimization::ParticleSwarm(0,0x4000000000000000,0,&local_3a8,&local_288,200,local_100);
      if (local_170 != (code *)0x0) {
        (*local_170)(&local_180,&local_180,3);
      }
      if (local_278 != (code *)0x0) {
        (*local_278)(&local_288,&local_288,__destroy_functor);
      }
      if (local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_418.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((double *)local_388[0]._0_8_ != (double *)0x0) {
        operator_delete((void *)local_388[0]._0_8_,
                        local_388[0].f_single.super__Function_base._M_functor._8_8_ -
                        local_388[0]._0_8_);
      }
      if (local_398 != (code *)0x0) {
        (*local_398)(&local_3a8,&local_3a8,3);
      }
      _Var7._M_current = (double *)((long)local_f8 * (long)local_fc * 8 + local_c0);
      std::vector<double,std::allocator<double>>::
      vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
                ((vector<double,std::allocator<double>> *)local_388,_Var7,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 (_Var7._M_current + local_fc),(allocator_type *)&local_418);
      pdVar3 = local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar2 = local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_388[0]._0_8_;
      local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_388[0].f_single.super__Function_base._M_functor._0_8_;
      local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)local_388[0].f_single.super__Function_base._M_functor._8_8_;
      local_388[0]._0_8_ = (double *)0x0;
      local_388[0].f_single.super__Function_base._M_functor._M_unused._M_object = (pointer)0x0;
      local_388[0].f_single.super__Function_base._M_functor._8_8_ = (pointer)0x0;
      if (pdVar2 != (double *)0x0) {
        operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
        if ((double *)local_388[0]._0_8_ != (double *)0x0) {
          operator_delete((void *)local_388[0]._0_8_,
                          local_388[0].f_single.super__Function_base._M_functor._8_8_ -
                          local_388[0]._0_8_);
        }
      }
      if (local_3d8 != (code *)0x0) {
        (*local_3d0)(&local_3e8,&local_458,&local_438);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Using the surrogate to the objective function\n",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"found best position after 200 iteration:\n",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"best value for x = ",0x13);
        poVar5 = std::ostream::_M_insert<double>
                           (*local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"best value for y = ",0x13);
        poVar5 = std::ostream::_M_insert<double>
                           (local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"value of the objective = ",0x19);
        poVar5 = std::ostream::_M_insert<double>
                           (*local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Note: the method will find only one of the minimums\n",
                   0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"      the random seed will determine which one.\n",0x30);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "---------------------------------------------------------------------------------------------------\n"
                   ,100);
        if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_400.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_400.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_400.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_400.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_228);
        if (local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_438.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_438.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_458.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_458.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_458.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_3d8 != (code *)0x0) {
          (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
        }
        TasOptimization::ParticleSwarmState::~ParticleSwarmState(local_100);
        return;
      }
    }
    std::__throw_bad_function_call();
  }
  uVar6 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar6);
}

Assistant:

void optimizaiton_example_01(){
#ifndef __TASMANIAN_DOXYGEN_SKIP
//! [OPT_Example_01 example]
#endif
    // using the default random engine, but must reset the random number generator
    std::srand(std::time(nullptr));

    // Example 1:
    cout << "\n" << "---------------------------------------------------------------------------------------------------\n";
    cout << std::scientific; cout.precision(5);
    cout << "EXAMPLE 1: use the Particle Swarm algorithm to minimize the six-hump camel function\n"
         << "           f(x,y) = (4-2.1 *x^2 + x^4 / 3) * x^2 + x * y + (-4 + 4 * y^2) * y^2\n"
         << "           domain is x in (-3, +3), y in (-2, +2)\n"
         << "           using 50 particles and 200 iterations\n"
         << "    See the comments in example_optimization_01.cpp\n\n";

     cout << "the problem has two solutions at (-8.98420e-02, 7.12656e-01) and (8.98420e-02, -7.12656e-01)\n"
          << "the objective at the solutions is -1.03163.\n\n";

     int num_dimensions = 2;
     int num_particles = 50;

     TasOptimization::ParticleSwarmState state(num_dimensions, num_particles);
     state.initializeParticlesInsideBox({-3.0, -2.0}, {3.0, 2.0});

     auto objective = TasOptimization::makeObjectiveFunction(
                    num_dimensions,
                    [](const std::vector<double> &x)->double {
                         return (4.0 - 2.1 * x[0]*x[0] + x[0]*x[0]*x[0]*x[0] / 3.0) * x[0]*x[0] +
                              x[0] * x[1] +
                              (-4.0 + 4.0 * x[1]*x[1]) * x[1]*x[1];
                    });

     int num_iterations = 200;
     double inertia_weight = 0.5, cognitive_coeff = 2.0, social_coeff = 2.0;
     TasOptimization::ParticleSwarm(objective,
                                    TasDREAM::hypercube({-3.0, -2.0}, {3.0, 2.0}),
                                    inertia_weight, cognitive_coeff, social_coeff,
                                    num_iterations, state);

     std::vector<double> best_position = state.getBestPosition();
     std::vector<double> best_objective(1);
     objective(best_position, best_objective);

     cout << "Using the objective function\n"
          << "found best position after 200 iteration:\n"
          << "best value for x = " << best_position[0] << "\n"
          << "best value for y = " << best_position[1] << "\n"
          << "value of the objective = " << best_objective[0] << "\n\n";


     // solve the same optimization problem, but use a sparse grid surrogate
     // first we create the surrogate, then we optimize

     auto grid = TasGrid::makeLocalPolynomialGrid(2, 1, 10);
     grid.setDomainTransform({-3.0, -2.0}, {3.0, 2.0});

     std::vector<double> points = grid.getNeededPoints();
     std::vector<double> values(grid.getNumNeeded());
     objective(points, values);
     grid.loadNeededValues(values); // at this point, we have the surrogate

     // reset the state
     state = TasOptimization::ParticleSwarmState(num_dimensions, num_particles);
     state.initializeParticlesInsideBox({-3.0, -2.0}, {3.0, 2.0});

     // the values of the objective function for all particle positions are computed in batch
     // thus, the problem is amenable to GPU acceleration
     // Note: if GPU acceleration is not available, Tasmanian will automatically fallback to CPU
     grid.enableAcceleration(TasGrid::accel_gpu_cuda);
     TasOptimization::ParticleSwarm(
                              [&](std::vector<double> const &x, std::vector<double> &y)->void{
                                   grid.evaluateBatch(x, y);
                              },
                              TasDREAM::hypercube({-3.0, -2.0}, {3.0, 2.0}),
                              inertia_weight, cognitive_coeff, social_coeff,
                              num_iterations, state);

     best_position = state.getBestPosition();
     objective(best_position, best_objective);

     cout << "Using the surrogate to the objective function\n"
          << "found best position after 200 iteration:\n"
          << "best value for x = " << best_position[0] << "\n"
          << "best value for y = " << best_position[1] << "\n"
          << "value of the objective = " << best_objective[0] << "\n\n";

     cout << "Note: the method will find only one of the minimums\n"
          << "      the random seed will determine which one.\n";


    cout << "\n" << "---------------------------------------------------------------------------------------------------\n";
#ifndef __TASMANIAN_DOXYGEN_SKIP
//! [OPT_Example_01 example]
#endif
}